

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

wchar_t scan_floor(object **items,wchar_t max_size,player *p,object_floor_t mode,item_tester tester)

{
  loc grid;
  loc grid_00;
  _Bool _Var1;
  object *obj;
  long lVar2;
  wchar_t wVar3;
  
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  _Var1 = square_in_bounds(cave,grid);
  if ((_Var1) &&
     (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, obj = square_object(cave,grid_00),
     L'\0' < max_size && obj != (object *)0x0)) {
    wVar3 = L'\0';
    while( true ) {
      if (((((mode & OFLOOR_TEST) == OFLOOR_NONE) || (_Var1 = object_test(tester,obj), _Var1)) &&
          (((mode & OFLOOR_SENSE) == OFLOOR_NONE || (obj->known != (object *)0x0)))) &&
         ((((mode & OFLOOR_VISIBLE) == OFLOOR_NONE || (_Var1 = is_unknown(obj), _Var1)) ||
          (_Var1 = ignore_item_ok(p,obj), !_Var1)))) {
        lVar2 = (long)wVar3;
        wVar3 = wVar3 + L'\x01';
        items[lVar2] = obj;
        if ((mode & OFLOOR_TOP) != OFLOOR_NONE) {
          return wVar3;
        }
      }
      obj = obj->next;
      if (obj == (object *)0x0) break;
      if (max_size <= wVar3) {
        return wVar3;
      }
    }
    return wVar3;
  }
  return L'\0';
}

Assistant:

int scan_floor(struct object **items, int max_size, struct player *p,
		object_floor_t mode, item_tester tester)
{
	struct object *obj;
	int num = 0;

	/* Sanity */
	if (!square_in_bounds(cave, p->grid)) return 0;

	/* Scan all objects in the grid */
	for (obj = square_object(cave, p->grid); obj; obj = obj->next) {
		/* Enforce limit */
		if (num >= max_size) break;

		/* Item tester */
		if ((mode & OFLOOR_TEST) && !object_test(tester, obj)) continue;

		/* Sensed or known */
		if ((mode & OFLOOR_SENSE) && (!obj->known)) continue;

		/* Visible */
		if ((mode & OFLOOR_VISIBLE) && !is_unknown(obj)
				&& ignore_item_ok(p, obj)) continue;

		/* Accept this item */
		items[num++] = obj;

		/* Only one */
		if (mode & OFLOOR_TOP) break;
	}

	return num;
}